

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::SinLayerParams::~SinLayerParams(SinLayerParams *this)

{
  SinLayerParams *this_local;
  
  ~SinLayerParams(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

SinLayerParams::~SinLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.SinLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}